

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O2

bool __thiscall
double_conversion::DoubleToStringConverter::ToPrecision
          (DoubleToStringConverter *this,double value,int precision,StringBuilder *result_builder)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long in_FS_OFFSET;
  int decimal_rep_length;
  bool sign;
  int decimal_point;
  char decimal_rep [121];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (0x7fefffffffffffff < (ulong)ABS(value)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      bVar2 = HandleSpecialValues(this,value,result_builder);
      return bVar2;
    }
    goto LAB_00396173;
  }
  if (precision - 0x79U < 0xffffff88) {
    bVar2 = false;
  }
  else {
    decimal_point = -0x55555556;
    sign = true;
    decimal_rep[0x70] = -0x56;
    decimal_rep._113_8_ = &DAT_aaaaaaaaaaaaaaaa;
    decimal_rep._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
    decimal_rep[0x68] = -0x56;
    decimal_rep[0x69] = -0x56;
    decimal_rep[0x6a] = -0x56;
    decimal_rep[0x6b] = -0x56;
    decimal_rep[0x6c] = -0x56;
    decimal_rep[0x6d] = -0x56;
    decimal_rep[0x6e] = -0x56;
    decimal_rep[0x6f] = -0x56;
    decimal_rep._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
    decimal_rep._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
    decimal_rep._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    decimal_rep._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
    decimal_rep._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    decimal_rep._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
    decimal_rep._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    decimal_rep._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    decimal_rep._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    decimal_rep._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    decimal_rep._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    decimal_rep._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    decimal_rep_length = -0x55555556;
    DoubleToAscii(value,PRECISION,precision,decimal_rep,0x79,&sign,&decimal_rep_length,
                  &decimal_point);
    if ((sign == true) && (value != 0.0 || (this->flags_ & 8U) == 0)) {
      iVar8 = *(int *)(result_builder + 0x10);
      *(int *)(result_builder + 0x10) = iVar8 + 1;
      *(undefined1 *)(*(long *)result_builder + (long)iVar8) = 0x2d;
    }
    uVar3 = 1;
    uVar4 = this->flags_;
    if (this->max_leading_padding_zeroes_in_precision_mode_ < 1 - decimal_point) {
      bVar2 = true;
      if ((uVar4 & 0x10) == 0) {
        uVar7 = (ulong)(uint)decimal_rep_length;
      }
      else {
LAB_003960f1:
        uVar7 = (ulong)decimal_rep_length;
        uVar4 = uVar3;
        if (decimal_rep_length <= (int)uVar3) {
          uVar4 = decimal_rep_length;
        }
        for (; (uVar5 = uVar4, (long)(ulong)uVar3 < (long)uVar7 &&
               (uVar5 = (uint)uVar7, decimal_rep[uVar7 - 1] == '0')); uVar7 = uVar7 - 1) {
          decimal_rep_length = uVar5 - 1;
        }
        if ((int)uVar5 < precision) {
          precision = uVar5;
        }
        if (!bVar2) goto LAB_003960c2;
      }
LAB_00396125:
      for (lVar6 = (long)(int)uVar7; lVar6 < precision; lVar6 = lVar6 + 1) {
        decimal_rep[lVar6] = '0';
      }
      CreateExponentialRepresentation(this,decimal_rep,precision,decimal_point + -1,result_builder);
    }
    else {
      iVar8 = (decimal_point - precision) + (uint)((uVar4 >> 2 & 1) != 0);
      if ((uVar4 & 0x10) != 0) {
        bVar2 = true;
        if (iVar8 <= this->max_trailing_padding_zeroes_in_precision_mode_) {
          if (1 < decimal_point) {
            uVar3 = decimal_point;
          }
          bVar2 = false;
        }
        goto LAB_003960f1;
      }
      uVar7 = (ulong)(uint)decimal_rep_length;
      if (this->max_trailing_padding_zeroes_in_precision_mode_ < iVar8) goto LAB_00396125;
LAB_003960c2:
      iVar8 = 0;
      if (0 < precision - decimal_point) {
        iVar8 = precision - decimal_point;
      }
      CreateDecimalRepresentation(this,decimal_rep,(int)uVar7,decimal_point,iVar8,result_builder);
    }
    bVar2 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
LAB_00396173:
  __stack_chk_fail();
}

Assistant:

bool DoubleToStringConverter::ToPrecision(double value,
                                          int precision,
                                          StringBuilder* result_builder) const {
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (precision < kMinPrecisionDigits || precision > kMaxPrecisionDigits) {
    return false;
  }

  // Find a sufficiently precise decimal representation of n.
  int decimal_point;
  bool sign;
  // Add one for the terminating null character.
  const int kDecimalRepCapacity = kMaxPrecisionDigits + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;

  DoubleToAscii(value, PRECISION, precision,
                decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);
  DOUBLE_CONVERSION_ASSERT(decimal_rep_length <= precision);

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  // The exponent if we print the number as x.xxeyyy. That is with the
  // decimal point after the first digit.
  int exponent = decimal_point - 1;

  int extra_zero = ((flags_ & EMIT_TRAILING_ZERO_AFTER_POINT) != 0) ? 1 : 0;
  bool as_exponential =
      (-decimal_point + 1 > max_leading_padding_zeroes_in_precision_mode_) ||
      (decimal_point - precision + extra_zero >
       max_trailing_padding_zeroes_in_precision_mode_);
  if ((flags_ & NO_TRAILING_ZERO) != 0) {
    // Truncate trailing zeros that occur after the decimal point (if exponential,
    // that is everything after the first digit).
    int stop = as_exponential ? 1 : std::max(1, decimal_point);
    while (decimal_rep_length > stop && decimal_rep[decimal_rep_length - 1] == '0') {
      --decimal_rep_length;
    }
    // Clamp precision to avoid the code below re-adding the zeros.
    precision = std::min(precision, decimal_rep_length);
  }
  if (as_exponential) {
    // Fill buffer to contain 'precision' digits.
    // Usually the buffer is already at the correct length, but 'DoubleToAscii'
    // is allowed to return less characters.
    for (int i = decimal_rep_length; i < precision; ++i) {
      decimal_rep[i] = '0';
    }

    CreateExponentialRepresentation(decimal_rep,
                                    precision,
                                    exponent,
                                    result_builder);
  } else {
    CreateDecimalRepresentation(decimal_rep, decimal_rep_length, decimal_point,
                                (std::max)(0, precision - decimal_point),
                                result_builder);
  }
  return true;
}